

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char  [7] kj::
          str<kj::_::DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,true,true>&,std::__detail::_Node_iterator<kj::StringPtr,true,true>>&>
                    (DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_&,_std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_>
                     *params)

{
  Array<char> local_28;
  
  _::operator*(&local_28);
  params->left = (_Node_iterator<kj::StringPtr,_true,_true> *)local_28.ptr;
  (params->right).super__Node_iterator_base<kj::StringPtr,_true>._M_cur =
       (__node_type *)local_28.size_;
  (params->op).content.ptr = (char *)local_28.disposer;
  local_28.ptr = (char *)0x0;
  local_28.size_ = 0;
  Array<char>::~Array(&local_28);
  return SUB87(params,0);
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}